

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_4::Validator::OnSimdLoadLaneExpr(Validator *this,SimdLoadLaneExpr *expr)

{
  Opcode opcode;
  Result RVar1;
  Address alignment;
  Var local_78;
  
  opcode.enum_ = (expr->opcode).enum_;
  Var::Var(&local_78,&(expr->super_MemoryExpr<(wabt::ExprType)44>).memidx);
  alignment = Opcode::GetAlignment(&expr->opcode,expr->align);
  RVar1 = SharedValidator::OnSimdLoadLane
                    (&this->validator_,
                     &(expr->super_MemoryExpr<(wabt::ExprType)44>).
                      super_ExprMixin<(wabt::ExprType)44>.super_Expr.loc,opcode,&local_78,alignment,
                     expr->offset,expr->val);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnSimdLoadLaneExpr(SimdLoadLaneExpr* expr) {
  result_ |= validator_.OnSimdLoadLane(expr->loc, expr->opcode, expr->memidx,
                                       expr->opcode.GetAlignment(expr->align),
                                       expr->offset, expr->val);
  return Result::Ok;
}